

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_assign(CURLM *multi_handle,curl_socket_t s,void *hashp)

{
  void *pvVar1;
  CURLMcode CVar2;
  undefined1 local_14 [4];
  
  CVar2 = CURLM_BAD_SOCKET;
  if (s != -1) {
    pvVar1 = Curl_hash_pick((curl_hash *)((long)multi_handle + 0x88),local_14,4);
    if (pvVar1 != (void *)0x0) {
      *(void **)((long)pvVar1 + 0x10) = hashp;
      CVar2 = CURLM_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_assign(CURLM *multi_handle,
                            curl_socket_t s, void *hashp)
{
  struct Curl_sh_entry *there = NULL;
  struct Curl_multi *multi = (struct Curl_multi *)multi_handle;

  if(s != CURL_SOCKET_BAD)
    there = Curl_hash_pick(&multi->sockhash, (char *)&s,
                           sizeof(curl_socket_t));

  if(!there)
    return CURLM_BAD_SOCKET;

  there->socketp = hashp;

  return CURLM_OK;
}